

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
pushPriority<helics::ActionMessage_const&>
          (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *this,
          ActionMessage *val)

{
  bool bVar1;
  bool expEmpty;
  unique_lock<std::mutex> pullLock;
  
  expEmpty = true;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&pullLock,(mutex_type *)(this + 0x28));
    LOCK();
    this[0x80] = (BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>)
                 0x0;
    UNLOCK();
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)(this + 0x88)
               ,val);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&pullLock,(mutex_type *)(this + 0x28));
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)(this + 0x88)
               ,val);
    expEmpty = true;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)(this + 0x80),&expEmpty,false,seq_cst);
    if (!bVar1) goto LAB_0028f266;
  }
  std::condition_variable::notify_all();
LAB_0028f266:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&pullLock);
  return;
}

Assistant:

void pushPriority(Z&& val)  // forwarding reference
        {
            bool expEmpty = true;
            if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                queueEmptyFlag = false;  // need to set the flag again just in
                                         // case after we get the lock
                priorityQueue.push(std::forward<Z>(val));
                // pullLock.unlock ();
                condition.notify_all();
            } else {
                std::unique_lock<MUTEX> pullLock(m_pullLock);
                priorityQueue.push(std::forward<Z>(val));
                expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    condition.notify_all();
                }
            }
        }